

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

HANDLE OpenProcess(DWORD dwDesiredAccess,BOOL bInheritHandle,DWORD dwProcessId)

{
  int iVar1;
  CPalThread *pCVar2;
  int *piVar3;
  undefined8 uStack_70;
  CObjectAttributes oa;
  IPalObject *pobjProcessRegistered;
  IDataLock *pDataLock;
  CProcProcessLocalData *pLocalData;
  HANDLE hProcess;
  IPalObject *pobjProcess;
  
  hProcess = (HANDLE)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  uStack_70 = 0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  oa.sObjectName.m_dwStringLength = 0;
  oa.sObjectName.m_dwMaxLength = 0;
  pLocalData = (CProcProcessLocalData *)0x0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00342c34;
  pCVar2 = CorUnix::InternalGetCurrentThread();
  if (dwProcessId == 0) {
    iVar1 = 0x57;
LAB_00342ba7:
    piVar3 = __errno_location();
    *piVar3 = iVar1;
  }
  else {
    iVar1 = (**(code **)*CorUnix::g_pObjectManager)
                      (CorUnix::g_pObjectManager,pCVar2,&CorUnix::otProcess,&uStack_70,&hProcess);
    if ((iVar1 != 0) ||
       (iVar1 = (**(code **)(*hProcess + 0x18))(hProcess,pCVar2,1,&pobjProcessRegistered,&pDataLock)
       , iVar1 != 0)) {
      if (hProcess != (HANDLE)0x0) {
        (**(code **)(*hProcess + 0x40))(hProcess,pCVar2);
      }
      goto LAB_00342ba7;
    }
    *(DWORD *)&pDataLock->_vptr_IDataLock = dwProcessId;
    (**pobjProcessRegistered->_vptr_IPalObject)(pobjProcessRegistered,pCVar2,1);
    iVar1 = (**(code **)(*CorUnix::g_pObjectManager + 8))
                      (CorUnix::g_pObjectManager,pCVar2,hProcess,&aotProcess,dwDesiredAccess,
                       &pLocalData,&oa.pSecurityAttributes);
    hProcess = (HANDLE)0x0;
    if (oa.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
      (**(code **)(*(long *)oa.pSecurityAttributes + 0x40))(oa.pSecurityAttributes,pCVar2);
    }
    if (iVar1 != 0) goto LAB_00342ba7;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return pLocalData;
  }
LAB_00342c34:
  abort();
}

Assistant:

HANDLE
PALAPI
OpenProcess(
        DWORD dwDesiredAccess,
        BOOL bInheritHandle,
        DWORD dwProcessId)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    IPalObject *pobjProcess = NULL;
    IPalObject *pobjProcessRegistered = NULL;
    IDataLock *pDataLock;
    CProcProcessLocalData *pLocalData;
    CObjectAttributes oa;
    HANDLE hProcess = NULL;

    PERF_ENTRY(OpenProcess);
    ENTRY("OpenProcess(dwDesiredAccess=0x%08x, bInheritHandle=%d, "
          "dwProcessId = 0x%08x)\n",
          dwDesiredAccess, bInheritHandle, dwProcessId );

    pThread = InternalGetCurrentThread();

    if (0 == dwProcessId)
    {
        palError = ERROR_INVALID_PARAMETER;
        goto OpenProcessExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otProcess,
        &oa,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        goto OpenProcessExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto OpenProcessExit;
    }

    pLocalData->dwProcessId = dwProcessId;
    pDataLock->ReleaseLock(pThread, TRUE);

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjProcess,
        &aotProcess,
        dwDesiredAccess,
        &hProcess,
        &pobjProcessRegistered
        );

    //
    // pobjProcess was invalidated by the above call, so NULL
    // it out here
    //

    pobjProcess = NULL;

    //
    // TODO: check to see if the process actually exists?
    //

OpenProcessExit:

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    if (NULL != pobjProcessRegistered)
    {
        pobjProcessRegistered->ReleaseReference(pThread);
    }

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("OpenProcess returns HANDLE %p\n", hProcess);
    PERF_EXIT(OpenProcess);
    return hProcess;
}